

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O1

DisasJumpType op_vlr(DisasContext_conflict13 *s,DisasOps *o)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (s->fields).presentO;
  if ((uVar1 >> 0x16 & 1) != 0) {
    uVar2 = (s->fields).c[0];
    if ((uVar2 & 0xe0) == 0) {
      if ((uVar1 >> 0x17 & 1) == 0) goto LAB_00cd5dd0;
      uVar1 = (s->fields).c[6];
      if ((uVar1 & 0xe0) == 0) {
        tcg_gen_gvec_mov_s390x
                  (s->uc->tcg_ctx,0,(uVar2 & 0x1f) * 0x10 + 0x80,(uVar1 & 0x1f) * 0x10 + 0x80,0x10,
                   0x10);
        return DISAS_NEXT;
      }
    }
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
               ,0xdf,"reg < 32");
  }
LAB_00cd5dd0:
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vlr(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    gen_gvec_mov(tcg_ctx, get_field(s, v1), get_field(s, v2));
    return DISAS_NEXT;
}